

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.c
# Opt level: O3

objc_protocol_method_description *
get_method_description(Protocol *p,SEL aSel,BOOL isRequiredMethod,BOOL isInstanceMethod)

{
  int *piVar1;
  BOOL BVar2;
  long lVar3;
  undefined7 in_register_00000011;
  int iVar4;
  
  if ((int)CONCAT71(in_register_00000011,isRequiredMethod) == 0) {
    if ((objc_class *)p->isa == &_OBJC_CLASS_ProtocolGCC) {
      return (objc_protocol_method_description *)0x0;
    }
    lVar3 = (ulong)(isInstanceMethod == '\0') * 8 + 0x28;
  }
  else {
    lVar3 = (ulong)(isInstanceMethod == '\0') * 8 + 0x18;
  }
  piVar1 = *(int **)((long)&p->isa + lVar3);
  if (piVar1 == (int *)0x0) {
    return (objc_protocol_method_description *)0x0;
  }
  if (*piVar1 < 1) {
    return (objc_protocol_method_description *)0x0;
  }
  iVar4 = 0;
  do {
    if ((uint)piVar1[1] < 0x10) {
LAB_001138f4:
      __assert_fail("l->size >= sizeof(struct objc_protocol_method_description)",
                    "/workspace/llm4binary/github/license_c_cmakelists/gnustep[P]libobjc2/protocol.h"
                    ,0x55,
                    "struct objc_protocol_method_description *protocol_method_at_index(struct objc_protocol_method_description_list *, int)"
                   );
    }
    BVar2 = sel_isEqual(*(SEL *)((long)piVar1 + (long)(piVar1[1] * iVar4) + 8),aSel);
    if (BVar2 != '\0') {
      if (0xf < (uint)piVar1[1]) {
        return (objc_protocol_method_description *)((long)piVar1 + (long)(piVar1[1] * iVar4) + 8);
      }
      goto LAB_001138f4;
    }
    iVar4 = iVar4 + 1;
    if (*piVar1 <= iVar4) {
      return (objc_protocol_method_description *)0x0;
    }
  } while( true );
}

Assistant:

static struct objc_protocol_method_description *
get_method_description(Protocol *p,
                       SEL aSel,
                       BOOL isRequiredMethod,
                       BOOL isInstanceMethod)
{
	struct objc_protocol_method_description_list *list =
		get_method_list(p, isRequiredMethod, isInstanceMethod);
	if (NULL == list)
	{
		return NULL;
	}
	for (int i=0 ; i<list->count ; i++)
	{
		SEL s = protocol_method_at_index(list, i)->selector;
		if (sel_isEqual(s, aSel))
		{
			return protocol_method_at_index(list, i);
		}
	}
	return NULL;
}